

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsGroupOf_PDU::IsGroupOf_PDU(IsGroupOf_PDU *this)

{
  IsGroupOf_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IsGroupOf_PDU_00331f50;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_GroupedEntityID);
  this->m_ui8GrpdEntCat = '\0';
  this->m_ui8NumOfGroupedEnts = '\0';
  this->m_ui32Padding1 = 0;
  this->m_f64GrpLat = 0.0;
  this->m_f64GrpLon = 0.0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ::vector(&this->m_vpGED);
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Header).super_Header6.m_ui8PDUType = '\"';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

IsGroupOf_PDU::IsGroupOf_PDU() :
    m_ui8GrpdEntCat( 0 ),
    m_ui8NumOfGroupedEnts( 0 ),
    m_ui32Padding1( 0 ),
    m_f64GrpLat( 0 ),
    m_f64GrpLon( 0 )
{
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = IsGroupOf_PDU_Type;
    m_ui16PDULength = IS_GROUP_OF_PDU_SIZE;
}